

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_matrix_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  string local_1e8;
  uint local_1c8;
  uint32_t i;
  string local_1b8;
  undefined1 local_191;
  undefined1 local_190 [8];
  SPIRType tmp_type;
  bool need_transpose_local;
  SPIRType *target_type_local;
  uint32_t count_local;
  uint32_t *indices_local;
  uint32_t base_local;
  CompilerGLSL *this_local;
  string *expr;
  
  tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ = need_transpose;
  if (matrix_stride == 0) {
    __assert_fail("matrix_stride",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x2ace,
                  "std::string spirv_cross::CompilerGLSL::flattened_access_chain_matrix(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
                 );
  }
  SPIRType::SPIRType((SPIRType *)local_190,target_type);
  if ((tmp_type.member_name_cache._M_h._M_single_bucket._7_1_ & 1) != 0) {
    ::std::swap<unsigned_int>(&tmp_type.basetype,&tmp_type.width);
  }
  local_191 = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  type_to_glsl_constructor_abi_cxx11_(&local_1b8,this,(SPIRType *)local_190);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
  for (local_1c8 = 0; local_1c8 < tmp_type.width; local_1c8 = local_1c8 + 1) {
    if (local_1c8 != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    flattened_access_chain_vector_abi_cxx11_
              (&local_1e8,this,base,indices,count,(SPIRType *)local_190,
               offset + local_1c8 * matrix_stride,matrix_stride,false);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
  }
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  local_191 = 1;
  SPIRType::~SPIRType((SPIRType *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_matrix(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	assert(matrix_stride);
	SPIRType tmp_type = target_type;
	if (need_transpose)
		swap(tmp_type.vecsize, tmp_type.columns);

	std::string expr;

	expr += type_to_glsl_constructor(tmp_type);
	expr += "(";

	for (uint32_t i = 0; i < tmp_type.columns; i++)
	{
		if (i != 0)
			expr += ", ";

		expr += flattened_access_chain_vector(base, indices, count, tmp_type, offset + i * matrix_stride, matrix_stride,
		                                      /* need_transpose= */ false);
	}

	expr += ")";

	return expr;
}